

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O0

void dec_edx(PDISASM pMyDisasm)

{
  int iVar1;
  PDISASM pMyDisasm_local;
  
  if ((pMyDisasm->Reserved_).Architecture == 0x40) {
    iVar1 = Security(2,pMyDisasm);
    if (iVar1 != 0) {
      (pMyDisasm->Reserved_).REX.W_ = '\x01';
      (pMyDisasm->Reserved_).REX.R_ = '\0';
      (pMyDisasm->Reserved_).REX.X_ = '\x01';
      (pMyDisasm->Reserved_).REX.B_ = '\0';
      (pMyDisasm->Reserved_).REX.state = '\x01';
      (pMyDisasm->Reserved_).EIP_ = (pMyDisasm->Reserved_).EIP_ + 1;
      (pMyDisasm->Reserved_).NB_PREFIX = (pMyDisasm->Reserved_).NB_PREFIX + 1;
      (pMyDisasm->Prefix).Number = (pMyDisasm->Prefix).Number + 1;
      (pMyDisasm->Reserved_).OperandSize = 0x40;
      (pMyDisasm->Instruction).Opcode = (uint)*(byte *)(pMyDisasm->Reserved_).EIP_;
      (*opcode_map1[*(byte *)(pMyDisasm->Reserved_).EIP_])(pMyDisasm);
      (pMyDisasm->Reserved_).OperandSize = 0x20;
    }
  }
  else {
    dec_args(pMyDisasm,2);
  }
  return;
}

Assistant:

void __bea_callspec__ dec_edx(PDISASM pMyDisasm)
{
    if (GV.Architecture == 64) {
        if (!Security(2, pMyDisasm)) return;
        GV.REX.W_ = 1;
        GV.REX.R_ = 0;
        GV.REX.X_ = 1;
        GV.REX.B_ = 0;
        GV.REX.state = InUsePrefix;
        GV.EIP_++;
        GV.NB_PREFIX++;
        pMyDisasm->Prefix.Number++;
        GV.OperandSize = 64;
        pMyDisasm->Instruction.Opcode = *((UInt8*) GV.EIP_);
        (void) opcode_map1[*((UInt8*) GV.EIP_)](pMyDisasm);
        GV.OperandSize = 32;

    }
    else {
      dec_args(pMyDisasm, 2);
    }
}